

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

int OPENSSL_strncasecmp(char *a,char *b,size_t n)

{
  int iVar1;
  int iVar2;
  int bb;
  int aa;
  size_t i;
  size_t n_local;
  char *b_local;
  char *a_local;
  
  _bb = 0;
  while( true ) {
    if (n <= _bb) {
      return 0;
    }
    iVar1 = OPENSSL_tolower((int)a[_bb]);
    iVar2 = OPENSSL_tolower((int)b[_bb]);
    if (iVar1 < iVar2) {
      return -1;
    }
    if (iVar2 < iVar1) {
      return 1;
    }
    if (iVar1 == 0) break;
    _bb = _bb + 1;
  }
  return 0;
}

Assistant:

int OPENSSL_strncasecmp(const char *a, const char *b, size_t n) {
  for (size_t i = 0; i < n; i++) {
    const int aa = OPENSSL_tolower(a[i]);
    const int bb = OPENSSL_tolower(b[i]);

    if (aa < bb) {
      return -1;
    } else if (aa > bb) {
      return 1;
    } else if (aa == 0) {
      return 0;
    }
  }

  return 0;
}